

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O2

void __thiscall OPN2::commitLFOSetup(OPN2 *this)

{
  long *plVar1;
  byte bVar2;
  size_t chip;
  ulong uVar3;
  long lVar4;
  
  bVar2 = this->m_lfoFrequency & 7 | this->m_lfoEnable << 3;
  this->m_regLFOSetup = bVar2;
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->m_numChips; uVar3 = uVar3 + 1) {
    plVar1 = *(long **)((long)&((this->m_chips).
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar4);
    (**(code **)(*plVar1 + 0x58))(plVar1,0,0x22,bVar2);
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void OPN2::commitLFOSetup()
{
    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;
    for(size_t chip = 0; chip < m_numChips; ++chip)
        writeReg(chip, 0, 0x22, regLFOSetup);
}